

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void __thiscall
TestCharReaderTestparseChineseWithOneError::runTestCase
          (TestCharReaderTestparseChineseWithOneError *this)

{
  int iVar1;
  CharReader *pCVar2;
  string errs;
  Value root;
  char doc [30];
  CharReaderBuilder b;
  undefined1 *local_b0;
  undefined8 local_a8;
  undefined1 local_a0 [16];
  Value local_90;
  char local_68 [32];
  CharReaderBuilder local_48;
  
  Json::CharReaderBuilder::CharReaderBuilder(&local_48);
  pCVar2 = Json::CharReaderBuilder::newCharReader(&local_48);
  local_a8 = 0;
  local_a0[0] = 0;
  local_b0 = local_a0;
  Json::Value::Value(&local_90,nullValue);
  builtin_strncpy(local_68 + 0x10," :: \"value\" }",0xe);
  builtin_strncpy(local_68,"{ \"pr佐藤erty\"",0x10);
  iVar1 = (*pCVar2->_vptr_CharReader[2])(pCVar2,local_68,local_68 + 0x1d,&local_90,&local_b0);
  if ((char)iVar1 != '\0') {
    JsonTest::TestResult::addFailure
              ((this->super_CharReaderTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
               ,0x72b,"!ok");
  }
  iVar1 = std::__cxx11::string::compare((char *)&local_b0);
  if (iVar1 != 0) {
    JsonTest::TestResult::addFailure
              ((this->super_CharReaderTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
               ,0x72e,
               "errs == \"* Line 1, Column 19\\n  Syntax error: value, object or array \" \"expected.\\n\""
              );
  }
  (*pCVar2->_vptr_CharReader[1])(pCVar2);
  Json::Value::~Value(&local_90);
  if (local_b0 != local_a0) {
    operator_delete(local_b0);
  }
  Json::CharReaderBuilder::~CharReaderBuilder(&local_48);
  return;
}

Assistant:

JSONTEST_FIXTURE(CharReaderTest, parseChineseWithOneError) {
  Json::CharReaderBuilder b;
  Json::CharReader* reader(b.newCharReader());
  std::string errs;
  Json::Value root;
  char const doc[] =
      "{ \"pr佐藤erty\" :: \"value\" }";
  bool ok = reader->parse(
      doc, doc + std::strlen(doc),
      &root, &errs);
  JSONTEST_ASSERT(!ok);
  JSONTEST_ASSERT(errs ==
                  "* Line 1, Column 19\n  Syntax error: value, object or array "
                  "expected.\n");
  delete reader;
}